

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

bool __thiscall storage::BTree::_erase_(BTree *this,int key,Record **out_record)

{
  BTNode *pBVar1;
  bool bVar2;
  int iVar3;
  BTInnerNode *pBVar4;
  BTLeafNode *local_c0;
  BTInnerNode *local_b0;
  BTLeafNode *local_98;
  BTInnerNode *local_88;
  int local_70;
  int local_6c;
  int i_1;
  int i;
  BTInnerNode *nd;
  BTNode *tt;
  BTInnerNode *cur;
  BTInnerNode *pBStack_48;
  int idx;
  BTInnerNode *parent;
  bool err;
  BTLeafNode *pBStack_38;
  bool err_1;
  BTLeafNode *leaf;
  BTNode *node;
  Record **out_record_local;
  BTree *pBStack_18;
  int key_local;
  BTree *this_local;
  
  if (this->root_ == (BTNode *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    leaf = (BTLeafNode *)this->root_;
    node = (BTNode *)out_record;
    out_record_local._4_4_ = key;
    pBStack_18 = this;
    while (iVar3 = (**(leaf->super_BTNode)._vptr_BTNode)(), (((byte)iVar3 ^ 0xff) & 1) != 0) {
      if (leaf == (BTLeafNode *)0x0) {
        local_88 = (BTInnerNode *)0x0;
      }
      else {
        local_88 = (BTInnerNode *)__dynamic_cast(leaf,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      }
      BTInnerNode::search_node(local_88,out_record_local._4_4_,(BTNode **)&leaf);
    }
    if (leaf == (BTLeafNode *)this->root_) {
      if (leaf == (BTLeafNode *)0x0) {
        local_98 = (BTLeafNode *)0x0;
      }
      else {
        local_98 = (BTLeafNode *)__dynamic_cast(leaf,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      }
      pBStack_38 = local_98;
      iVar3 = BTNode::key_count(&local_98->super_BTNode);
      if (iVar3 < 2) {
        iVar3 = BTNode::key_count(&pBStack_38->super_BTNode);
        if (iVar3 != 1) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0xd4,"bool storage::BTree::_erase_(int, Record *&)");
        }
        node->_vptr_BTNode = (_func_int **)pBStack_38->record_links_[0];
        if (this->root_ != (BTNode *)0x0) {
          operator_delete(this->root_,0xe0);
        }
        this->root_ = (BTNode *)0x0;
        this_local._7_1_ = true;
      }
      else {
        parent._7_1_ = 0;
        BTLeafNode::erase_(pBStack_38,out_record_local._4_4_,&node->_vptr_BTNode,
                           (bool *)((long)&parent + 7));
        if ((parent._7_1_ & 1) == 0) {
          if (node->_vptr_BTNode != (_func_int **)0x0) {
            __assert_fail("out_record == nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                          ,0xc9,"bool storage::BTree::_erase_(int, Record *&)");
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = true;
        }
      }
    }
    else {
      parent._6_1_ = 0;
      pBVar1 = (leaf->super_BTNode).parent_;
      if (pBVar1 == (BTNode *)0x0) {
        local_b0 = (BTInnerNode *)0x0;
      }
      else {
        local_b0 = (BTInnerNode *)__dynamic_cast(pBVar1,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      }
      pBStack_48 = local_b0;
      if (leaf == (BTLeafNode *)0x0) {
        local_c0 = (BTLeafNode *)0x0;
      }
      else {
        local_c0 = (BTLeafNode *)__dynamic_cast(leaf,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      }
      cur._4_4_ = BTLeafNode::erase_(local_c0,out_record_local._4_4_,&node->_vptr_BTNode,
                                     (bool *)((long)&parent + 6));
      if ((parent._6_1_ & 1) == 0) {
        if (node->_vptr_BTNode != (_func_int **)0x0) {
          __assert_fail("out_record == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0xdb,"bool storage::BTree::_erase_(int, Record *&)");
        }
        this_local._7_1_ = false;
      }
      else {
        tt = (BTNode *)0x0;
        pBVar4 = pBStack_48;
        while (pBStack_48 = pBVar4, cur._4_4_ != -1) {
          pBVar4 = pBStack_48;
          if (pBStack_48 != (BTInnerNode *)0x0) {
            pBVar1 = pBStack_48->links_[cur._4_4_ + 1];
            pBVar4 = BTInnerNode::erase_(pBStack_48,cur._4_4_,(int *)((long)&cur + 4));
            if ((pBVar4 == (BTInnerNode *)0x0) && (cur._4_4_ != -1)) {
              if (pBStack_48 != (BTInnerNode *)this->root_) {
                __assert_fail("parent == root_",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                              ,0xe5,"bool storage::BTree::_erase_(int, Record *&)");
              }
              tt = &pBStack_48->super_BTNode;
              break;
            }
            if (pBVar1 != (BTNode *)0x0) {
              operator_delete(pBVar1,0xe0);
            }
          }
        }
        if (tt != (BTNode *)0x0) {
          iVar3 = cur._4_4_;
          if (tt->used_links_count_ < 3) {
            if (tt->used_links_count_ != 2) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                            ,0x100,"bool storage::BTree::_erase_(int, Record *&)");
            }
            if (tt[1].parent_ != (BTNode *)0x0) {
              operator_delete(tt[1].parent_,0xe0);
            }
            this->root_ = (BTNode *)tt[1]._vptr_BTNode;
            this->root_->parent_ = (BTNode *)0x0;
            this->root_->child_index_ = -1;
            if (tt != (BTNode *)0x0) {
              operator_delete(tt,0x278);
            }
          }
          else {
            while (local_6c = iVar3 + 1, local_6c < tt->used_links_count_ + -1) {
              tt->keys_[iVar3] = tt->keys_[local_6c];
              iVar3 = local_6c;
            }
            if (*(void **)(tt[1].keys_ + (long)(cur._4_4_ + 1) * 2 + -5) != (void *)0x0) {
              operator_delete(*(void **)(tt[1].keys_ + (long)(cur._4_4_ + 1) * 2 + -5),0xe0);
            }
            for (local_70 = cur._4_4_ + 2; local_70 < tt->used_links_count_; local_70 = local_70 + 1
                ) {
              BTInnerNode::set_link
                        ((BTInnerNode *)tt,local_70 + -1,
                         *(BTNode **)(tt[1].keys_ + (long)local_70 * 2 + -5));
            }
            tt->used_links_count_ = tt->used_links_count_ + -1;
            bVar2 = ll((BTNode **)(tt + 1),tt->used_links_count_);
            if (!bVar2) {
              __assert_fail("ll(cur->links_, cur->used_links_count_)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                            ,0xf8,"bool storage::BTree::_erase_(int, Record *&)");
            }
          }
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BTree::_erase_(int key, Record *&out_record) {
        if (!root_) {
            return false;   /* EMPTY */
        }
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        if (node == root_) {
            auto leaf = dynamic_cast<BTLeafNode *>(node);
            if (leaf->key_count() > 1) {
                bool err = false;
                leaf->erase_(key, out_record, err);
                if (!err) {
                    assert(out_record == nullptr);
                    return false; // not exists
                } else
                    return true;

            } else if (leaf->key_count() == 1) {
                out_record = leaf->record_links_[0];
                delete root_;
                root_ = nullptr;
                return true;
            } else {
                assert(false);
            }
        }
        bool err = false;
        BTInnerNode *parent = dynamic_cast<BTInnerNode *>(node->parent_);
        int idx = dynamic_cast<BTLeafNode *>(node)->erase_(key, out_record, err);
        if (!err) {
            assert(out_record == nullptr);
            return false; // not exists
        }

        BTInnerNode *cur = nullptr;
        while (idx != -1) {
            if (parent) {
                auto tt = parent->links_[idx + 1];
                BTInnerNode *nd = parent->erase_(idx, idx);
                if (!nd && idx != -1) {
                    assert(parent == root_);
                    cur = parent;
                    break;
                } else {
                    delete tt;
                    parent = nd;
                }
            }
        }
        if (cur) {
            if (cur->used_links_count_ > 2) {
                for (int i = idx + 1; i < cur->used_links_count_ - 1; ++i) {
                    cur->keys_[i - 1] = cur->keys_[i];
                }
                delete cur->links_[idx + 1];
                for (int i = idx + 2; i < cur->used_links_count_; ++i) {
                    cur->set_link(i - 1, cur->links_[i]);
                }
                cur->used_links_count_--;
                assert(ll(cur->links_, cur->used_links_count_));
            } else if (cur->used_links_count_ == 2) {
                delete cur->links_[1];
                root_ = cur->links_[0];
                root_->parent_ = nullptr;
                root_->child_index_ = -1;
                delete cur;
            } else {
                assert(false);
            }
        }
        return true;
    }